

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

sunrealtype ** SUNDlsMat_newBandMat(sunindextype n,sunindextype smu,sunindextype ml)

{
  long lVar1;
  sunrealtype *psVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  sunindextype colSize;
  sunindextype j;
  sunrealtype **a;
  long local_30;
  sunrealtype **local_8;
  
  if (in_RDI < 1) {
    local_8 = (sunrealtype **)0x0;
  }
  else {
    local_8 = (sunrealtype **)malloc(in_RDI << 3);
    if (local_8 == (sunrealtype **)0x0) {
      local_8 = (sunrealtype **)0x0;
    }
    else {
      lVar1 = in_RSI + in_RDX + 1;
      *local_8 = (sunrealtype *)0x0;
      psVar2 = (sunrealtype *)malloc(in_RDI * lVar1 * 8);
      *local_8 = psVar2;
      if (*local_8 == (sunrealtype *)0x0) {
        free(local_8);
        local_8 = (sunrealtype **)0x0;
      }
      else {
        for (local_30 = 1; local_30 < in_RDI; local_30 = local_30 + 1) {
          local_8[local_30] = *local_8 + local_30 * lVar1;
        }
      }
    }
  }
  return local_8;
}

Assistant:

sunrealtype** SUNDlsMat_newBandMat(sunindextype n, sunindextype smu,
                                   sunindextype ml)
{
  sunrealtype** a;
  sunindextype j, colSize;

  if (n <= 0) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  colSize = smu + ml + 1;
  a[0]    = NULL;
  a[0]    = (sunrealtype*)malloc(n * colSize * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * colSize; }

  return (a);
}